

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O1

void __thiscall
TPZFront<std::complex<float>_>::TPZFront(TPZFront<std::complex<float>_> *this,void **vtt)

{
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  TPZManVector<long,_10>::TPZManVector(&this->fGlobal,0);
  (this->fLocal)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->fLocal).fStore = (long *)0x0;
  (this->fLocal).fNElements = 0;
  (this->fLocal).fNAlloc = 0;
  TPZStack<int,_10>::TPZStack(&this->fFree);
  (this->fData)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01842418;
  (this->fData).fStore = (complex<float> *)0x0;
  (this->fData).fNElements = 0;
  (this->fData).fNAlloc = 0;
  this->fExpandRatio = 200;
  this->fDecomposeType = ELU;
  this->fWork = 0;
  this->fMaxFront = 0;
  this->fProductMTData = (STensorProductMTData *)0x0;
  this->fFront = 0;
  this->fNextRigidBodyMode = 0;
  return;
}

Assistant:

TPZFront<TVar>::TPZFront(){
	fExpandRatio = 200;
	fFront = 0;
	fMaxFront=0;
	fWork = 0;
	fNextRigidBodyMode = 0;
	fProductMTData = NULL;
    fDecomposeType = ELU;
}